

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.cc
# Opt level: O0

vector<double,_std::allocator<double>_> * gmath::realRoots(Polynomiald *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int i_00;
  double *pdVar5;
  Polynomial<double> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  Polynomial<double> *pPVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  int i;
  double r;
  int hn;
  int ln;
  SturmChaind s;
  double v;
  vector<double,_std::allocator<double>_> *ret;
  value_type *in_stack_fffffffffffffe88;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe90;
  SturmChain<double> *in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  double in_stack_fffffffffffffeb8;
  double in_stack_fffffffffffffec0;
  Polynomial<double> *in_stack_ffffffffffffff28;
  SturmChain<double> *in_stack_ffffffffffffff30;
  double local_80;
  int local_74;
  double local_70;
  int local_68;
  int local_64;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  undefined1 local_11;
  Polynomial<double> *local_10;
  
  local_11 = 0;
  local_10 = in_RSI;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x11eae7);
  iVar1 = Polynomial<double>::getDegree(local_10);
  if (iVar1 == 1) {
    dVar7 = Polynomial<double>::operator[](local_10,0);
    local_30 = Polynomial<double>::operator[](local_10,1);
    local_30 = -dVar7 / local_30;
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  }
  else {
    iVar1 = Polynomial<double>::getDegree(local_10);
    if (iVar1 == 2) {
      dVar7 = Polynomial<double>::operator[](local_10,1);
      dVar8 = Polynomial<double>::operator[](local_10,1);
      dVar9 = Polynomial<double>::operator[](local_10,2);
      dVar10 = Polynomial<double>::operator[](local_10,0);
      local_38 = dVar7 * dVar8 + -(dVar9 * 4.0 * dVar10);
      if (local_38 <= 0.0) {
        if ((local_38 == 0.0) && (!NAN(local_38))) {
          dVar7 = Polynomial<double>::operator[](local_10,1);
          dVar8 = Polynomial<double>::operator[](local_10,2);
          local_50 = -dVar7 / (dVar8 + dVar8);
          std::vector<double,_std::allocator<double>_>::push_back
                    (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
        }
      }
      else {
        local_38 = sqrt(local_38);
        dVar7 = Polynomial<double>::operator[](local_10,1);
        dVar7 = local_38 - dVar7;
        dVar8 = Polynomial<double>::operator[](local_10,2);
        local_40 = dVar7 / (dVar8 + dVar8);
        std::vector<double,_std::allocator<double>_>::push_back
                  (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
        dVar7 = Polynomial<double>::operator[](local_10,1);
        dVar7 = -dVar7 - local_38;
        dVar8 = Polynomial<double>::operator[](local_10,2);
        local_48 = dVar7 / (dVar8 + dVar8);
        std::vector<double,_std::allocator<double>_>::push_back
                  (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      }
    }
    else {
      iVar1 = Polynomial<double>::getDegree(local_10);
      if (2 < iVar1) {
        SturmChain<double>::SturmChain(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        iVar2 = SturmChain<double>::countSignChangesNegInf
                          ((SturmChain<double> *)
                           CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
        local_64 = iVar2;
        iVar3 = SturmChain<double>::countSignChangesPosInf
                          ((SturmChain<double> *)
                           CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
        local_68 = iVar3;
        if (0 < local_64 - iVar3) {
          local_70 = 0.0;
          iVar4 = Polynomial<double>::getDegree(local_10);
          local_74 = iVar4 + -1;
          if (-1 < local_74) {
            for (; -1 < local_74; local_74 = local_74 + -1) {
              pPVar6 = local_10;
              in_stack_fffffffffffffec0 = Polynomial<double>::operator[](local_10,local_74);
              std::abs((int)pPVar6);
              local_70 = extraout_XMM0_Qa + local_70;
              in_stack_fffffffffffffeb8 = extraout_XMM0_Qa;
            }
          }
          i_00 = Polynomial<double>::getDegree(local_10);
          in_stack_fffffffffffffea0 =
               (SturmChain<double> *)Polynomial<double>::operator[](local_10,i_00);
          std::abs((int)local_10);
          local_70 = local_70 / extraout_XMM0_Qa_00;
          local_80 = 1.0;
          pdVar5 = std::max<double>(&local_80,&local_70);
          local_70 = *pdVar5 * 1e-12 + *pdVar5;
          anon_unknown_3::findRoots
                    ((vector<double,_std::allocator<double>_> *)CONCAT44(iVar1,iVar2),
                     (SturmChaind *)CONCAT44(iVar3,iVar4),in_stack_fffffffffffffec0,
                     in_stack_fffffffffffffeb8,i_00,in_stack_fffffffffffffeb0);
        }
        SturmChain<double>::~SturmChain(in_stack_fffffffffffffea0);
      }
    }
  }
  return in_RDI;
}

Assistant:

std::vector<double> realRoots(const Polynomiald &p)
{
  std::vector<double> ret;

  // call direct solution, if the degree is <= 3

  if (p.getDegree() == 1) // compute solution to first degree in closed form
  {
    ret.push_back(-p[0]/p[1]);
  }
  else if (p.getDegree() == 2) // compute solution to second degree in closed form
  {
    double v;

    v=p[1]*p[1]-4*p[2]*p[0];

    if (v > 0)
    {
      v=sqrt(v);

      ret.push_back((-p[1]+v)/(2*p[2]));
      ret.push_back((-p[1]-v)/(2*p[2]));
    }
    else if (v == 0)
    {
      ret.push_back(-p[1]/(2*p[2]));
    }
  }
  else if (p.getDegree() > 2) // compute solutions of higher degrees using Sturm chains
  {
    SturmChaind s(p);
    int ln=s.countSignChangesNegInf();
    int hn=s.countSignChangesPosInf();

    if (ln-hn > 0)
    {
      // determine radius around the origin that contains all roots using
      // Gerschgorins theorem

      double r=0;

      int i=p.getDegree()-1;
      if (i >= 0)
      {
        while (i >= 0)
        {
          r+=std::abs(p[i]);
          i--;
        }
      }

      r/=std::abs(p[p.getDegree()]);
      r=std::max(1.0, r);
      r+=r*1e-12;

      // recursively determine all roots

      findRoots(ret, s, -r, r, ln, hn);
    }
  }

  return ret;
}